

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall ImgfsFile::printfileinfo(ImgfsFile *this,string *romname)

{
  bool bVar1;
  undefined8 *puVar2;
  reference ppVar3;
  element_type *this_00;
  _Self local_28;
  _Self local_20;
  iterator fi;
  string *romname_local;
  ImgfsFile *this_local;
  
  fi._M_node = (_Base_ptr)romname;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ImgfsFile::FileEntry>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ImgfsFile::FileEntry>_>_>_>
       ::find(&this->_files,romname);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ImgfsFile::FileEntry>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ImgfsFile::FileEntry>_>_>_>
       ::end(&this->_files);
  bVar1 = std::operator==(&local_20,&local_28);
  if (!bVar1) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ImgfsFile::FileEntry>_>_>
             ::operator*(&local_20);
    this_00 = std::
              __shared_ptr_access<ImgfsFile::FileEntry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<ImgfsFile::FileEntry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&ppVar3->second);
    FileEntry::listentry(this_00,this);
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "dump: not found";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

virtual void printfileinfo(const std::string&romname)
    {
        filemap_t::iterator fi= _files.find(romname);
        if (fi==_files.end())
            throw "dump: not found";

        (*fi).second->listentry(*this);
    }